

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

APInt __thiscall llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long *in_RSI;
  APInt AVar4;
  
  if ((undefined1 *)*in_RSI != semIEEEsingle) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEsingle",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb7d,"APInt llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt() const");
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  uVar3 = bVar1 & 7;
  if (uVar3 == 3 || (bVar1 & 6) == 0) {
    uVar2 = 0;
    if (uVar3 == 3) {
      uVar3 = 0;
    }
    else {
      if (uVar3 == 1) {
        uVar2 = *(uint *)(in_RSI + 1);
      }
      else if ((bVar1 & 7) != 0) {
        __assert_fail("category == fcNaN && \"Unknown category!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xb8e,"APInt llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt() const");
      }
      uVar3 = 0xff;
    }
  }
  else {
    uVar3 = (int)(short)in_RSI[2] + 0x7f;
    uVar2 = *(uint *)(in_RSI + 1);
    if (uVar3 == 1) {
      uVar3 = uVar2 >> 0x17 & 1;
    }
  }
  AVar4.BitWidth = (uVar3 & 0xff) << 0x17 | (bVar1 & 0xfffffff8) << 0x1c;
  *(undefined4 *)&this->significand = 0x20;
  this->semantics = (fltSemantics *)(ulong)(uVar2 & 0x7fffff | AVar4.BitWidth);
  AVar4.U.pVal = (uint64_t *)this;
  AVar4._12_4_ = 0;
  return AVar4;
}

Assistant:

APInt IEEEFloat::convertFloatAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEsingle);
  assert(partCount()==1);

  uint32_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+127; //bias
    mysignificand = (uint32_t)*significandParts();
    if (myexponent == 1 && !(mysignificand & 0x800000))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0xff;
    mysignificand = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0xff;
    mysignificand = (uint32_t)*significandParts();
  }

  return APInt(32, (((sign&1) << 31) | ((myexponent&0xff) << 23) |
                    (mysignificand & 0x7fffff)));
}